

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord3d>(Attribute *this,texcoord3d *v)

{
  double dVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::texcoord3d> ret;
  optional<tinyusdz::value::texcoord3d> local_58;
  optional<tinyusdz::value::texcoord3d> local_38;
  
  if (v == (texcoord3d *)0x0) {
    local_58.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::texcoord3d>(&local_58,&this->_var);
    local_38.has_value_ = local_58.has_value_;
    if (local_58.has_value_ != false) {
      local_38.contained._16_8_ = local_58.contained._16_8_;
      local_38.contained.data.__align = local_58.contained.data.__align;
      local_38.contained._8_8_ = local_58.contained._8_8_;
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::texcoord3d>::value(&local_38);
      dVar1 = pvVar2->t;
      v->s = pvVar2->s;
      v->t = dVar1;
      v->r = pvVar2->r;
    }
  }
  return local_58.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }